

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

Result __thiscall
anon_unknown.dwarf_9bac16::QFactoryLoaderIidSearch::operator()
          (QFactoryLoaderIidSearch *this,QtPluginMetaDataKeys key,QCborStreamReader *reader)

{
  long lVar1;
  bool bVar2;
  Result RVar3;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QStringView lhs;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (key == IID) {
    QCborStreamReader::readAllString(&local_30,(QCborStreamReader *)reader);
    lVar1 = (this->iid).m_size;
    if (local_30.d.size == lVar1) {
      rhs.m_data = (this->iid).m_data;
      rhs.m_size = lVar1;
      lhs.m_data = local_30.d.ptr;
      lhs.m_size = local_30.d.size;
      bVar2 = QtPrivate::equalStrings(lhs,rhs);
    }
    else {
      bVar2 = false;
    }
    this->matchesIid = bVar2;
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    RVar3 = FinishedSearch;
  }
  else {
    QCborStreamReader::next((QCborStreamReader *)reader,10000);
    RVar3 = ContinueSearch;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return RVar3;
  }
  __stack_chk_fail();
}

Assistant:

IterationResult::Result operator()(QtPluginMetaDataKeys key, QCborStreamReader &reader)
    {
        if (key != QtPluginMetaDataKeys::IID)
            return skip(reader);
        matchesIid = (reader.readAllString() == iid);
        return IterationResult::FinishedSearch;
    }